

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_parse.c
# Opt level: O1

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  yysymbol_kind_t yVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  char *yyres;
  int iVar11;
  ulong uVar12;
  long lVar13;
  char *__s;
  bool bVar14;
  yysymbol_kind_t yyarg [5];
  yysymbol_kind_t local_58;
  int local_54 [7];
  char **local_38;
  
  yVar2 = yyctx->yytoken;
  uVar12 = 0;
  if (yVar2 != YYSYMBOL_YYEMPTY) {
    uVar12 = (ulong)*yyctx->yyssp;
    iVar4 = 0;
    if ((0x5eabbf2c760dU >> (uVar12 & 0x3f) & 1) == 0) {
      iVar10 = (int)yypact[uVar12];
      iVar7 = -iVar10;
      iVar4 = 0;
      if ((0x5eebff2c767dU >> (uVar12 & 0x3f) & 1) == 0) {
        iVar7 = 0;
      }
      iVar11 = 0x18;
      if (0x26 - iVar10 < 0x18) {
        iVar11 = 0x26 - iVar10;
      }
      if (iVar7 < iVar11) {
        lVar8 = (long)iVar7;
        iVar4 = 0;
        do {
          if ((lVar8 != 1) && (lVar8 == "\v\x10\x11\x12\x13\x14"[iVar10 + lVar8])) {
            if (iVar4 == 4) {
              iVar4 = 0;
              goto LAB_00103ed4;
            }
            lVar13 = (long)iVar4;
            iVar4 = iVar4 + 1;
            local_54[lVar13] = (int)lVar8;
          }
          lVar8 = lVar8 + 1;
        } while (iVar11 != lVar8);
      }
    }
    if (iVar4 == 0) {
      local_54[0] = -2;
    }
LAB_00103ed4:
    uVar12 = (ulong)(iVar4 + 1);
    local_58 = yVar2;
    if (iVar4 == -2) {
      uVar12 = 0xfffffffe;
    }
  }
  __s = "syntax error";
  iVar4 = (int)uVar12;
  switch(iVar4) {
  case 1:
    __s = "syntax error, unexpected %s";
    break;
  case 2:
    __s = "syntax error, unexpected %s, expecting %s";
    break;
  case 3:
    __s = "syntax error, unexpected %s, expecting %s or %s";
    break;
  case 4:
    __s = "syntax error, unexpected %s, expecting %s or %s or %s";
    break;
  case 5:
    __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
    break;
  case -2:
    return iVar4;
  }
  local_38 = yymsg;
  sVar5 = strlen(__s);
  lVar8 = (sVar5 - (long)(iVar4 * 2)) + 1;
  bVar14 = 0 < iVar4;
  if (0 < iVar4) {
    lVar6 = yytnamerr((char *)0x0,yytname[local_58]);
    lVar13 = 0;
    if (-1 < lVar6) {
      lVar13 = lVar6;
    }
    lVar8 = lVar13 + lVar8;
    if (-1 < lVar6) {
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar12 == uVar9) break;
        lVar6 = yytnamerr((char *)0x0,yytname[local_54[uVar9 - 1]]);
        lVar13 = 0;
        if (-1 < lVar6) {
          lVar13 = lVar6;
        }
        lVar8 = lVar8 + lVar13;
        uVar3 = uVar9 + 1;
      } while (-1 < lVar6);
      bVar14 = uVar9 < uVar12;
    }
  }
  iVar7 = -2;
  if (!bVar14) {
    if (lVar8 <= *yymsg_alloc) {
      yyres = *local_38;
      iVar7 = 0;
      do {
        cVar1 = *__s;
        *yyres = cVar1;
        lVar8 = 1;
        if (cVar1 == '%') {
          if ((__s[1] == 's') && (iVar7 < iVar4)) {
            lVar8 = (long)iVar7;
            iVar7 = iVar7 + 1;
            lVar8 = yytnamerr(yyres,yytname[local_54[lVar8 + -1]]);
            lVar13 = 2;
          }
          else {
            lVar13 = 1;
          }
        }
        else {
          lVar13 = 1;
          if (cVar1 == '\0') {
            return 0;
          }
        }
        yyres = yyres + lVar8;
        __s = __s + lVar13;
      } while( true );
    }
    lVar13 = lVar8 * 2;
    lVar6 = 0x7fffffffffffffff;
    if (lVar8 == lVar13 || SBORROW8(lVar8,lVar13) != 0 < lVar8) {
      lVar6 = lVar13;
    }
    *yymsg_alloc = lVar6;
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}